

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O1

BOOL __thiscall
Js::DictionaryTypeHandlerBase<int>::FindNextProperty
          (DictionaryTypeHandlerBase<int> *this,ScriptContext *scriptContext,BigPropertyIndex *index
          ,JavascriptString **propertyStringName,PropertyId *propertyId,
          PropertyAttributes *attributes,Type *type,DynamicType *typeToEnumerate,
          EnumeratorFlags flags,DynamicObject *instance,PropertyValueInfo *info)

{
  byte bVar1;
  PropertyId propertyId_00;
  PropertyRecord *pPVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  DictionaryPropertyDescriptor<int> *pDVar6;
  PropertyRecord **ppPVar7;
  PropertyString *pPVar8;
  int index_00;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  
  if (propertyStringName == (JavascriptString **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0xb6,"(propertyStringName)","propertyStringName");
    if (!bVar4) goto LAB_00da6219;
    *puVar5 = 0;
  }
  if (propertyId == (PropertyId *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0xb7,"(propertyId)","propertyId");
    if (!bVar4) goto LAB_00da6219;
    *puVar5 = 0;
  }
  if (type == (Type *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0xb8,"(type)","type");
    if (!bVar4) {
LAB_00da6219:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  index_00 = *index;
  this_00 = (this->propertyMap).ptr;
  if (index_00 < this_00->count - this_00->freeCount) {
    do {
      pDVar6 = JsUtil::
               BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               ::GetValueAt(this_00,index_00);
      bVar1 = pDVar6->Attributes;
      if ((((bVar1 & 8) == 0) && (((flags & EnumNonEnumerable) != None || ((bVar1 & 1) != 0)))) &&
         (((bVar1 & 0x10) == 0 || (((bVar1 & 0x10) == 0 || ((pDVar6->flags & IsShadowed) != None))))
         )) {
        ppPVar7 = JsUtil::
                  BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  ::GetKeyAt((this->propertyMap).ptr,*index);
        pPVar2 = *ppPVar7;
        if (((flags & EnumSymbols) != None) || (pPVar2->isSymbol == false)) {
          if (attributes != (PropertyAttributes *)0x0) {
            *attributes = bVar1;
          }
          propertyId_00 = pPVar2->pid;
          *propertyId = propertyId_00;
          pPVar8 = ScriptContext::GetPropertyString(scriptContext,propertyId_00);
          *propertyStringName = &pPVar8->super_JavascriptString;
          return 1;
        }
      }
      index_00 = *index + 1;
      *index = index_00;
      this_00 = (this->propertyMap).ptr;
    } while (index_00 < this_00->count - this_00->freeCount);
  }
  return 0;
}

Assistant:

BOOL DictionaryTypeHandlerBase<BigPropertyIndex>::FindNextProperty(ScriptContext* scriptContext, BigPropertyIndex& index, JavascriptString** propertyStringName,
        PropertyId* propertyId, PropertyAttributes* attributes, Type* type, DynamicType *typeToEnumerate, EnumeratorFlags flags, DynamicObject* instance, PropertyValueInfo* info)
    {
        Assert(propertyStringName);
        Assert(propertyId);
        Assert(type);

        for (; index < propertyMap->Count(); ++index)
        {
            DictionaryPropertyDescriptor<BigPropertyIndex> descriptor = propertyMap->GetValueAt(index);
            PropertyAttributes attribs = descriptor.Attributes;
            if (!(attribs & PropertyDeleted) && (!!(flags & EnumeratorFlags::EnumNonEnumerable) || (attribs & PropertyEnumerable)) &&
                (!(attribs & PropertyLetConstGlobal) || descriptor.HasNonLetConstGlobal()))
            {
                const PropertyRecord* propertyRecord = propertyMap->GetKeyAt(index);

                // Skip this property if it is a symbol and we are not including symbol properties
                if (!(flags & EnumeratorFlags::EnumSymbols) && propertyRecord->IsSymbol())
                {
                    continue;
                }

                if (attributes != nullptr)
                {
                    *attributes = attribs;
                }

                *propertyId = propertyRecord->GetPropertyId();
                *propertyStringName = scriptContext->GetPropertyString(*propertyId);

                return TRUE;
            }
        }

        return FALSE;
    }